

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mt19937_64.hpp
# Opt level: O1

basic_ostream<char,_std::char_traits<char>_> *
trng::operator<<(basic_ostream<char,_std::char_traits<char>_> *out,status_type *S)

{
  undefined4 uVar1;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  char local_39;
  io_range<const_unsigned_long_*> local_38;
  
  uVar1 = *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = 0x26;
  local_38.first._0_1_ = 0x28;
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(out,(char *)&local_38,1);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,S->mti);
  local_38.first = (unsigned_long *)CONCAT71(local_38.first._1_7_,0x20);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>(poVar2,(char *)&local_38,1);
  local_38.first = S->mt;
  local_38.last = (unsigned_long *)(S + 1);
  local_38.delim_str = " ";
  pbVar3 = utility::operator<<(poVar2,&local_38);
  local_39 = ')';
  std::__ostream_insert<char,std::char_traits<char>>(pbVar3,&local_39,1);
  *(undefined4 *)(out + *(long *)(*(long *)out + -0x18) + 0x18) = uVar1;
  return out;
}

Assistant:

std::basic_ostream<char_t, traits_t> &operator<<(
          std::basic_ostream<char_t, traits_t> &out, const status_type &S) {
        std::ios_base::fmtflags flags(out.flags());
        out.flags(std::ios_base::dec | std::ios_base::fixed | std::ios_base::left);
        out << '(' << S.mti << ' ' << utility::make_io_range(S.mt, S.mt + N, " ") << ')';
        out.flags(flags);
        return out;
      }